

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.hpp
# Opt level: O2

bool __thiscall
cfgfile::lexical_analyzer_t<cfgfile::string_trait_t>::process_back_slash
          (lexical_analyzer_t<cfgfile::string_trait_t> *this,char_t *ch)

{
  bool bVar1;
  char_t cVar2;
  char_t *pcVar3;
  exception_t<cfgfile::string_trait_t> *this_00;
  allocator local_17b;
  allocator local_17a;
  allocator local_179;
  string local_178 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  string local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = input_stream_t<cfgfile::string_trait_t>::at_end(this->m_stream);
  if (bVar1) {
    this_00 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              (local_d8,"Unexpected end of file. Unfinished back slash sequence. In file \"",
               &local_179);
    std::__cxx11::string::string((string *)&local_b8,local_d8);
    std::operator+(&local_98,&local_b8,&this->m_stream->m_file_name);
    std::__cxx11::string::string(local_118,"\" on line ",&local_17a);
    std::__cxx11::string::string((string *)&local_f8,local_118);
    std::operator+(&local_78,&local_98,&local_f8);
    std::__cxx11::to_string(&local_138,this->m_stream->m_line_number);
    std::operator+(&local_58,&local_78,&local_138);
    std::__cxx11::string::string(local_178,".",&local_17b);
    std::__cxx11::string::string((string *)&local_158,local_178);
    std::operator+(&local_38,&local_58,&local_158);
    exception_t<cfgfile::string_trait_t>::exception_t(this_00,&local_38);
    __cxa_throw(this_00,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  cVar2 = input_stream_t<cfgfile::string_trait_t>::get(this->m_stream);
  *ch = cVar2;
  if (cVar2 == const_t<cfgfile::string_trait_t>::c_n) {
    pcVar3 = &const_t<cfgfile::string_trait_t>::c_carriage_return;
  }
  else if (cVar2 == const_t<cfgfile::string_trait_t>::c_t) {
    pcVar3 = &const_t<cfgfile::string_trait_t>::c_tab;
  }
  else {
    if (cVar2 != const_t<cfgfile::string_trait_t>::c_r) {
      if (cVar2 == const_t<cfgfile::string_trait_t>::c_quotes) {
        return true;
      }
      return cVar2 == const_t<cfgfile::string_trait_t>::c_back_slash;
    }
    pcVar3 = &const_t<cfgfile::string_trait_t>::c_line_feed;
  }
  *ch = *pcVar3;
  return true;
}

Assistant:

bool process_back_slash( typename Trait::char_t & ch )
	{
		if( m_stream.at_end() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected end of file. "
					"Unfinished back slash sequence. In file \"" ) +
				m_stream.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_stream.line_number() ) +
				Trait::from_ascii( "." ) );

		ch = m_stream.get();

		if( ch == const_t< Trait >::c_n )
			ch = const_t< Trait >::c_carriage_return;
		else if( ch == const_t< Trait >::c_t )
			ch = const_t< Trait >::c_tab;
		else if( ch == const_t< Trait >::c_r )
			ch = const_t< Trait >::c_line_feed;
		else if( ch == const_t< Trait >::c_quotes )
			ch = const_t< Trait >::c_quotes;
		else if( ch == const_t< Trait >::c_back_slash )
			ch = const_t< Trait >::c_back_slash;
		else
			return false;

		return true;
	}